

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgproc-benchmark.cpp
# Opt level: O0

void __thiscall ProgramOptions::run(ProgramOptions *this)

{
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  element_type *this_00;
  long in_RDI;
  double dVar3;
  WaterEffectOptions *in_stack_00000070;
  Image *in_stack_00000078;
  Timer tt;
  shared_ptr<Image> img_baseline_result;
  shared_ptr<Image> img;
  string *in_stack_ffffffffffffff28;
  Timer *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  string local_78 [96];
  __shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  Image::fromPNG(in_stack_ffffffffffffff68);
  std::shared_ptr<Image>::shared_ptr((shared_ptr<Image> *)0x122616);
  Timer::Timer(in_stack_ffffffffffffff30);
  Timer::start(in_stack_ffffffffffffff30);
  std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get(&local_18);
  runWaterEffect(in_stack_00000078,in_stack_00000070);
  std::shared_ptr<Image>::operator=
            ((shared_ptr<Image> *)in_stack_ffffffffffffff30,
             (shared_ptr<Image> *)in_stack_ffffffffffffff28);
  std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x122680);
  Timer::stop(in_stack_ffffffffffffff30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Full pipeline (baseline): ");
  dVar3 = Timer::seconds(in_stack_ffffffffffffff30);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar2," s.");
  std::ostream::operator<<(__lhs,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator!=((shared_ptr<Image> *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                        ((__shared_ptr_access<Image,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         0x122727);
    std::operator+(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::operator+(__lhs,(char *)this_00);
    Image::toPNG(this_00,in_stack_ffffffffffffff28);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
  }
  if ((*(byte *)(in_RDI + 0x20) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Project was built without CUDA support.\nSkipping CUDA pipeline and test."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x122825);
  std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x122832);
  return;
}

Assistant:

void run() {
    // Load the image.
    auto img = Image::fromPNG(input_file);
    std::shared_ptr<Image> img_baseline_result;

    Timer tt;

    // Start the total pipeline measurement.
    tt.start();
    img_baseline_result = runWaterEffect(img.get(), &water_opts);
    // Stop the timer for the baseline pipeline.
    tt.stop();
    std::cout << "Full pipeline (baseline): " << tt.seconds() << " s." << std::endl;


    // Save the final result if any image was produced
    if (img_baseline_result != nullptr) {
      img_baseline_result->toPNG("output/" + water_opts.img_name + "_result.png");
    }

    // Run the whole pipeline using CUDA
    if (cuda) {
#ifdef USE_CUDA
      tt.start();
      auto img_cuda_result = runWaterEffectCUDA(img.get(), &water_opts);
      tt.stop();
      std::cout << "Full pipeline (CUDA):     " << tt.seconds() << " s." << std::endl;

      if (img_cuda_result != nullptr) {
        img_cuda_result->toPNG("output/" + water_opts.img_name + "_result.png");
      } else {
        std::cerr << "CUDA water effect returned nullptr. Cannot output PNG." << std::endl;
      }

      // Compare the CUDA implementation to the baseline if testing is enabled
      if (test) {
        if (img_cuda_result != nullptr) {
          if (img_cuda_result->is_approximately_equal_to(img_baseline_result.get())) {
            std::cout << "Test passed." << std::endl;
          } else {
            std::cout << "Test failed." << std::endl;
          }
        } else {
          std::cerr << "CUDA water effect returned nullptr. Cannot test approximate equality." << std::endl;
        }
      }
#else
      std::cout << "Project was built without CUDA support.\n"
                   "Skipping CUDA pipeline and test." << std::endl;
#endif
    }
  }